

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O0

void __thiscall
cppwinrt::writer_base<cppwinrt::writer>::
write_segment<winmd::reader::TypeDef,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,std::basic_string_view<char,std::char_traits<char>>>
          (writer_base<cppwinrt::writer> *this,string_view *value,TypeDef *first,
          coded_index<winmd::reader::TypeDefOrRef> *rest,
          basic_string_view<char,_std::char_traits<char>_> *rest_1)

{
  size_type sVar1;
  const_reference pvVar2;
  size_type sVar3;
  size_t __n;
  void *__buf;
  void *__buf_00;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  size_type local_38;
  size_type offset;
  basic_string_view<char,_std::char_traits<char>_> *rest_local_1;
  coded_index<winmd::reader::TypeDefOrRef> *rest_local;
  TypeDef *first_local;
  string_view *value_local;
  writer_base<cppwinrt::writer> *this_local;
  
  offset = (size_type)rest_1;
  rest_local_1 = (basic_string_view<char,_std::char_traits<char>_> *)rest;
  rest_local = (coded_index<winmd::reader::TypeDefOrRef> *)first;
  first_local = (TypeDef *)value;
  value_local = (string_view *)this;
  local_38 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of(value,"^%@",0);
  if (local_38 == 0xffffffffffffffff) {
    __assert_fail("offset != std::string_view::npos",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                  ,0x125,
                  "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = winmd::reader::TypeDef, Rest = <winmd::reader::coded_index<winmd::reader::TypeDefOrRef>, std::basic_string_view<char>>]"
                 );
  }
  local_48 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       ((basic_string_view<char,_std::char_traits<char>_> *)first_local,0,local_38);
  write(this,(int)&local_48,local_48._M_str,(size_t)rest);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                     ((basic_string_view<char,_std::char_traits<char>_> *)first_local,local_38);
  sVar1 = local_38;
  if (*pvVar2 == '^') {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)first_local);
    __n = sVar3 - 1;
    if (sVar1 == __n) {
      __assert_fail("offset != value.size() - 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                    ,0x12a,
                    "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = winmd::reader::TypeDef, Rest = <winmd::reader::coded_index<winmd::reader::TypeDefOrRef>, std::basic_string_view<char>>]"
                   );
    }
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)first_local,local_38 + 1
                       );
    write(this,(int)*pvVar2,__buf,__n);
    local_58 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)first_local,
                          local_38 + 2,0xffffffffffffffff);
    write_segment<winmd::reader::TypeDef,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,std::basic_string_view<char,std::char_traits<char>>>
              (this,&local_58,(TypeDef *)rest_local,
               (coded_index<winmd::reader::TypeDefOrRef> *)rest_local_1,
               (basic_string_view<char,_std::char_traits<char>_> *)offset);
  }
  else {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)first_local,local_38);
    if (*pvVar2 != '%') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                    ,0x13d,
                    "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = winmd::reader::TypeDef, Rest = <winmd::reader::coded_index<winmd::reader::TypeDefOrRef>, std::basic_string_view<char>>]"
                   );
    }
    cppwinrt::writer::write((writer *)this,(int)rest_local,__buf_00,(size_t)rest);
    local_68 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)first_local,
                          local_38 + 1,0xffffffffffffffff);
    write_segment<winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,std::basic_string_view<char,std::char_traits<char>>>
              (this,&local_68,(coded_index<winmd::reader::TypeDefOrRef> *)rest_local_1,
               (basic_string_view<char,_std::char_traits<char>_> *)offset);
  }
  return;
}

Assistant:

void write_segment(std::string_view const& value, First const& first, Rest const&... rest)
        {
            auto offset = value.find_first_of("^%@");
            assert(offset != std::string_view::npos);
            write(value.substr(0, offset));

            if (value[offset] == '^')
            {
                assert(offset != value.size() - 1);

                write(value[offset + 1]);
                write_segment(value.substr(offset + 2), first, rest...);
            }
            else
            {
                if (value[offset] == '%')
                {
                    static_cast<T*>(this)->write(first);
                }
                else
                {
                    if constexpr (std::is_convertible_v<First, std::string_view>)
                    {
                        static_cast<T*>(this)->write_code(first);
                    }
                    else
                    {
                        assert(false); // '@' placeholders are only for text.
                    }
                }

                write_segment(value.substr(offset + 1), rest...);
            }
        }